

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffInfo.cpp
# Opt level: O0

void __thiscall ApprovalTests::DiffInfo::DiffInfo(DiffInfo *this,string *program_,Type type_)

{
  undefined4 in_EDX;
  string *in_RSI;
  string *in_RDI;
  
  ::std::__cxx11::string::string(in_RDI,in_RSI);
  getDefaultArguments_abi_cxx11_();
  *(undefined4 *)(in_RDI + 0x40) = in_EDX;
  return;
}

Assistant:

DiffInfo::DiffInfo(std::string program_, Type type_)
        : program(std::move(program_)), arguments(getDefaultArguments()), type(type_)
    {
    }